

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::RemoveInventory(AActor *this,AInventory *item)

{
  AActor *pAVar1;
  AInventory *pAVar2;
  AInventory *pAVar3;
  
  if (item != (AInventory *)0x0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)&item->Owner);
    if (pAVar1 != (AActor *)0x0) {
      pAVar2 = (AInventory *)GC::ReadBarrier<AActor>((AActor **)&item->Owner);
      do {
        pAVar3 = pAVar2;
        pAVar2 = (pAVar3->super_AActor).Inventory.field_0.p;
        if (pAVar2 == (AInventory *)0x0) {
          return;
        }
      } while (pAVar2 != item);
      pAVar2 = GC::ReadBarrier<AInventory>((AInventory **)&(item->super_AActor).Inventory);
      (pAVar3->super_AActor).Inventory.field_0.p = pAVar2;
      (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x32])(item);
      (item->Owner).field_0.p = (AActor *)0x0;
      (item->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void AActor::RemoveInventory(AInventory *item)
{
	AInventory *inv, **invp;

	if (item != NULL && item->Owner != NULL)	// can happen if the owner was destroyed by some action from an item's use state.
	{
		invp = &item->Owner->Inventory;
		for (inv = *invp; inv != NULL; invp = &inv->Inventory, inv = *invp)
		{
			if (inv == item)
			{
				*invp = item->Inventory;
				item->DetachFromOwner();
				item->Owner = NULL;
				item->Inventory = NULL;
				break;
			}
		}
	}
}